

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O2

uchar * unbase64(char *ascii,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  
  if (len < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
    *flen = 0;
  }
  else {
    uVar7 = (ascii[(ulong)(uint)len - 1] == '=') + 1;
    if (ascii[(ulong)(uint)len - 2] != '=') {
      uVar7 = (uint)(ascii[(ulong)(uint)len - 1] == '=');
    }
    iVar4 = ((uint)(len * 3) >> 2) - uVar7;
    *flen = iVar4;
    pbVar5 = (byte *)malloc((long)iVar4);
    if (pbVar5 != (byte *)0x0) {
      pbVar6 = pbVar5;
      for (lVar8 = 0; lVar8 <= (int)((len - uVar7) + -4); lVar8 = lVar8 + 4) {
        bVar1 = ""[(byte)ascii[lVar8 + 1]];
        bVar2 = ""[(byte)ascii[lVar8 + 2]];
        bVar3 = ascii[lVar8 + 3];
        *pbVar6 = bVar1 >> 4 | ""[(byte)ascii[lVar8]] << 2;
        bVar3 = ""[bVar3];
        pbVar6[1] = bVar2 >> 2 | bVar1 << 4;
        pbVar6[2] = bVar2 << 6 | bVar3;
        pbVar6 = pbVar6 + 3;
      }
      if (uVar7 != 1) {
        if (uVar7 != 2) {
          return pbVar5;
        }
        *pbVar6 = ""[(byte)ascii[lVar8 + 1]] >> 4 | ""[(byte)ascii[lVar8]] << 2;
        return pbVar5;
      }
      bVar1 = ""[(byte)ascii[lVar8 + 1]];
      bVar2 = ""[(byte)ascii[lVar8 + 2]];
      *pbVar6 = bVar1 >> 4 | ""[(byte)ascii[lVar8]] << 2;
      pbVar6[1] = bVar2 >> 2 | bVar1 << 4;
      return pbVar5;
    }
    puts("ERROR: unbase64 could not allocate enough memory.");
    puts("I must stop because I could not get enough");
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char* unbase64(const char* ascii, int len, int *flen) {
	const unsigned char *safeAsciiPtr = (const unsigned char*) ascii;
	unsigned char *bin;
	int cb = 0;
	int charNo;
	int pad = 0;

	if (len < 2) { // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts(
				"ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		*flen = 0;
		return 0;
	}
	if (safeAsciiPtr[len - 1] == '=')
		++pad;
	if (safeAsciiPtr[len - 2] == '=')
		++pad;

	*flen = 3 * len / 4 - pad;
	bin = (unsigned char*) malloc(*flen);
	if (!bin) {
		puts("ERROR: unbase64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
		bin[cb++] = (C << 6) | (D);
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];

		bin[cb++] = (A << 2) | (B >> 4);
	}

	return bin;
}